

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  ushort uVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  KeyValue *pKVar5;
  size_t __n;
  KeyValue *this_00;
  int local_c;
  ulong uVar3;
  
  this_00 = (this->map_).flat;
  local_c = key;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    uVar3 = (ulong)uVar1;
    pKVar5 = this_00 + uVar1;
    if (uVar1 != 0) {
      do {
        uVar2 = uVar3 >> 1;
        uVar4 = uVar2;
        if (this_00[uVar2].first < key) {
          uVar4 = ~uVar2 + uVar3;
          this_00 = this_00 + uVar2 + 1;
        }
        uVar3 = uVar4;
      } while (0 < (long)uVar4);
    }
    if ((this_00 != pKVar5) && (*(int *)&((_Rep_type *)&this_00->first)->_M_impl == key)) {
      __n = (long)pKVar5 - (long)(this_00 + 1);
      if (__n != 0) {
        memmove(this_00,this_00 + 1,__n);
      }
      this->flat_size_ = this->flat_size_ - 1;
    }
  }
  else {
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             *)this_00,&local_c);
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    std::copy(it + 1, end, it);
    --flat_size_;
  }
}